

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrSpatialAnchorSpaceCreateInfoMSFT *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  code *pcVar1;
  void *value_00;
  undefined8 uVar2;
  XrSpatialAnchorSpaceCreateInfoMSFT *pXVar3;
  bool bVar4;
  XrInstance pXVar5;
  ostream *this;
  XrPosef *value_01;
  invalid_argument *piVar6;
  allocator local_351;
  string local_350 [32];
  string local_330 [32];
  string local_310 [8];
  string poseinanchorspace_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0 [32];
  ostringstream local_2d0 [8];
  ostringstream oss_anchor;
  string local_158 [8];
  string anchor_prefix;
  string local_138 [32];
  string local_118 [8];
  string next_prefix;
  __cxx11 local_f8 [32];
  char acStack_d8 [8];
  char type_string_1 [64];
  string local_90 [8];
  string type_prefix;
  undefined1 local_60 [40];
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *contents_local;
  string *psStack_30;
  bool is_pointer_local;
  string *type_string_local;
  string *prefix_local;
  XrSpatialAnchorSpaceCreateInfoMSFT *value_local;
  XrGeneratedDispatchTable *gen_dispatch_table_local;
  
  local_60._32_8_ = contents;
  contents_local._7_1_ = is_pointer;
  psStack_30 = type_string;
  type_string_local = prefix;
  prefix_local = (string *)value;
  value_local = (XrSpatialAnchorSpaceCreateInfoMSFT *)gen_dispatch_table;
  PointerToHexString<XrSpatialAnchorSpaceCreateInfoMSFT>
            ((XrSpatialAnchorSpaceCreateInfoMSFT *)local_60);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  if ((contents_local._7_1_ & 1) == 0) {
    std::__cxx11::string::operator+=((string *)prefix,".");
  }
  else {
    std::__cxx11::string::operator+=((string *)prefix,"->");
  }
  std::__cxx11::string::string(local_90,(string *)prefix);
  std::__cxx11::string::operator+=(local_90,"type");
  uVar2 = local_60._32_8_;
  if (value_local == (XrSpatialAnchorSpaceCreateInfoMSFT *)0x0) {
    std::__cxx11::to_string(local_f8,*(int *)prefix_local);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar2,(char (*) [16])"XrStructureType",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
  }
  else {
    type_string_1[0x28] = '\0';
    type_string_1[0x29] = '\0';
    type_string_1[0x2a] = '\0';
    type_string_1[0x2b] = '\0';
    type_string_1[0x2c] = '\0';
    type_string_1[0x2d] = '\0';
    type_string_1[0x2e] = '\0';
    type_string_1[0x2f] = '\0';
    type_string_1[0x30] = '\0';
    type_string_1[0x31] = '\0';
    type_string_1[0x32] = '\0';
    type_string_1[0x33] = '\0';
    type_string_1[0x34] = '\0';
    type_string_1[0x35] = '\0';
    type_string_1[0x36] = '\0';
    type_string_1[0x37] = '\0';
    type_string_1[0x18] = '\0';
    type_string_1[0x19] = '\0';
    type_string_1[0x1a] = '\0';
    type_string_1[0x1b] = '\0';
    type_string_1[0x1c] = '\0';
    type_string_1[0x1d] = '\0';
    type_string_1[0x1e] = '\0';
    type_string_1[0x1f] = '\0';
    type_string_1[0x20] = '\0';
    type_string_1[0x21] = '\0';
    type_string_1[0x22] = '\0';
    type_string_1[0x23] = '\0';
    type_string_1[0x24] = '\0';
    type_string_1[0x25] = '\0';
    type_string_1[0x26] = '\0';
    type_string_1[0x27] = '\0';
    type_string_1[8] = '\0';
    type_string_1[9] = '\0';
    type_string_1[10] = '\0';
    type_string_1[0xb] = '\0';
    type_string_1[0xc] = '\0';
    type_string_1[0xd] = '\0';
    type_string_1[0xe] = '\0';
    type_string_1[0xf] = '\0';
    type_string_1[0x10] = '\0';
    type_string_1[0x11] = '\0';
    type_string_1[0x12] = '\0';
    type_string_1[0x13] = '\0';
    type_string_1[0x14] = '\0';
    type_string_1[0x15] = '\0';
    type_string_1[0x16] = '\0';
    type_string_1[0x17] = '\0';
    acStack_d8[0] = '\0';
    acStack_d8[1] = '\0';
    acStack_d8[2] = '\0';
    acStack_d8[3] = '\0';
    acStack_d8[4] = '\0';
    acStack_d8[5] = '\0';
    acStack_d8[6] = '\0';
    acStack_d8[7] = '\0';
    type_string_1[0] = '\0';
    type_string_1[1] = '\0';
    type_string_1[2] = '\0';
    type_string_1[3] = '\0';
    type_string_1[4] = '\0';
    type_string_1[5] = '\0';
    type_string_1[6] = '\0';
    type_string_1[7] = '\0';
    pcVar1 = (code *)value_local[1].next;
    pXVar5 = FindInstanceFromDispatchTable((XrGeneratedDispatchTable *)value_local);
    (*pcVar1)(pXVar5,*(undefined4 *)prefix_local,acStack_d8);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)local_60._32_8_,(char (*) [16])"XrStructureType",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (char (*) [64])acStack_d8);
  }
  std::__cxx11::string::string(local_118,(string *)prefix);
  std::__cxx11::string::operator+=(local_118,"next");
  pXVar3 = value_local;
  value_00 = *(void **)(prefix_local + 8);
  std::__cxx11::string::string(local_138,local_118);
  bVar4 = ApiDumpDecodeNextChain
                    ((XrGeneratedDispatchTable *)pXVar3,value_00,(string *)local_138,
                     (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_60._32_8_);
  std::__cxx11::string::~string(local_138);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string(local_158,(string *)prefix);
    std::__cxx11::string::operator+=(local_158,"anchor");
    std::__cxx11::ostringstream::ostringstream(local_2d0);
    this = (ostream *)std::ostream::operator<<((ostream *)local_2d0,std::hex);
    std::ostream::operator<<(this,*(void **)(prefix_local + 0x10));
    uVar2 = local_60._32_8_;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[20],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar2,(char (*) [20])"XrSpatialAnchorMSFT",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
               local_2f0);
    std::__cxx11::string::~string((string *)local_2f0);
    std::__cxx11::string::string(local_310,(string *)prefix);
    std::__cxx11::string::operator+=(local_310,"poseInAnchorSpace");
    pXVar3 = value_local;
    value_01 = (XrPosef *)(prefix_local + 0x18);
    std::__cxx11::string::string(local_330,local_310);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_350,"XrPosef",&local_351);
    bVar4 = ApiDumpOutputXrStruct
                      ((XrGeneratedDispatchTable *)pXVar3,value_01,(string *)local_330,
                       (string *)local_350,false,
                       (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_60._32_8_);
    std::__cxx11::string::~string(local_350);
    std::allocator<char>::~allocator((allocator<char> *)&local_351);
    std::__cxx11::string::~string(local_330);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      gen_dispatch_table_local._7_1_ = 1;
      std::__cxx11::string::~string(local_310);
      std::__cxx11::ostringstream::~ostringstream(local_2d0);
      std::__cxx11::string::~string(local_158);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_90);
      return (bool)(gen_dispatch_table_local._7_1_ & 1);
    }
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Invalid Operation");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar6,"Invalid Operation");
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSpatialAnchorSpaceCreateInfoMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string anchor_prefix = prefix;
        anchor_prefix += "anchor";
        std::ostringstream oss_anchor;
        oss_anchor << std::hex << reinterpret_cast<const void*>(value->anchor);
        contents.emplace_back("XrSpatialAnchorMSFT", anchor_prefix, oss_anchor.str());
        std::string poseinanchorspace_prefix = prefix;
        poseinanchorspace_prefix += "poseInAnchorSpace";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->poseInAnchorSpace, poseinanchorspace_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}